

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint64_t absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                   (ulong state,uchar *first,ulong len)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  uint64_t uVar3;
  size_t sVar4;
  size_t len_local;
  uchar *first_local;
  uint64_t state_local;
  MultType m;
  ulong local_38;
  uint64_t v;
  
  if (8 < len) {
    sVar4 = PiecewiseChunkSize();
    if (sVar4 < len) {
      uVar3 = CombineLargeContiguousImpl32(state,first,len);
      return uVar3;
    }
    uVar2 = CityHash32((char *)first,len);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = state ^ uVar2;
    return SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),0) ^
           SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),8);
  }
  if (len < 9) {
    if (len < 4) {
      if (len == 0) {
        return state;
      }
      uVar2 = Read1To3(first,len);
      local_38 = (ulong)uVar2;
    }
    else {
      local_38 = Read4To8(first,len);
    }
    uVar3 = gbswap_64((state ^ local_38) * -0x234dd359734ecb13);
    return uVar3;
  }
  __assert_fail("len <= 8",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/hash/internal/hash.h"
                ,0x495,
                "static uint64_t absl::hash_internal::MixingHashState::CombineSmallContiguousImpl(uint64_t, const unsigned char *, size_t)"
               );
}

Assistant:

inline uint64_t MixingHashState::CombineContiguousImpl(
    uint64_t state, const unsigned char* first, size_t len,
    std::integral_constant<int, 4> /* sizeof_size_t */) {
  // For large values we use CityHash, for small ones we just use a
  // multiplicative hash.
  if (len <= 8) {
    return CombineSmallContiguousImpl(state, first, len);
  }
  if (ABSL_PREDICT_TRUE(len <= PiecewiseChunkSize())) {
    return Mix(state ^ hash_internal::CityHash32(
                           reinterpret_cast<const char*>(first), len),
               kMul);
  }
  return CombineLargeContiguousImpl32(state, first, len);
}